

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

void __thiscall duckdb::TopNHeap::Combine(TopNHeap *this,TopNHeap *other)

{
  string_t *sort_key;
  pointer pTVar1;
  bool bVar2;
  idx_t sel_count;
  ulong sel_count_00;
  long lVar3;
  idx_t i;
  ulong uVar4;
  anon_union_16_2_67f50693_for_value local_48;
  long local_38;
  
  lVar3 = 0;
  uVar4 = 0;
  sel_count_00 = 0;
  while( true ) {
    pTVar1 = (other->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
             super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(other->heap).
                       super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                       super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x18) <= uVar4)
    break;
    sort_key = (string_t *)((long)&(pTVar1->sort_key).value + lVar3);
    bVar2 = EntryShouldBeAdded(this,sort_key);
    if (!bVar2) break;
    if ((sort_key->value).pointer.length < 0xd) {
      local_48.pointer.ptr = (char *)*(undefined8 *)((long)&(pTVar1->sort_key).value + lVar3 + 8);
      local_48._0_8_ = *(undefined8 *)((long)&(pTVar1->sort_key).value + lVar3);
    }
    else {
      local_48.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)StringHeap::AddBlob(&this->sort_key_heap,sort_key)
      ;
    }
    local_38 = (this->heap_data).count + sel_count_00;
    AddEntryToHeap(this,(TopNEntry *)&local_48.pointer);
    sel_count = sel_count_00 + 1;
    (this->matching_sel).sel_vector[sel_count_00] = *(sel_t *)((long)&pTVar1->index + lVar3);
    if (0x7fe < sel_count_00) {
      DataChunk::Append(&this->heap_data,&other->heap_data,true,&this->matching_sel,sel_count);
      sel_count = 0;
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x18;
    sel_count_00 = sel_count;
  }
  if (sel_count_00 != 0) {
    DataChunk::Append(&this->heap_data,&other->heap_data,true,&this->matching_sel,sel_count_00);
  }
  Reduce(this);
  return;
}

Assistant:

void TopNHeap::Combine(TopNHeap &other) {
	// "other" is sorted at this point
	idx_t match_count = 0;
	// merge the heap of other into this
	for (idx_t i = 0; i < other.heap.size(); i++) {
		// heap is full - check the latest entry
		auto &other_entry = other.heap[i];
		auto &sort_key = other_entry.sort_key;
		if (!EntryShouldBeAdded(sort_key)) {
			break; // We can break out of the loop here since we sorted the heap
		}
		// add this entry
		TopNEntry new_entry;
		new_entry.sort_key = sort_key.IsInlined() ? sort_key : sort_key_heap.AddBlob(sort_key);
		new_entry.index = heap_data.size() + match_count;
		AddEntryToHeap(new_entry);

		matching_sel.set_index(match_count++, other_entry.index);
		if (match_count >= STANDARD_VECTOR_SIZE) {
			// flush
			heap_data.Append(other.heap_data, true, &matching_sel, match_count);
			match_count = 0;
		}
	}
	if (match_count > 0) {
		// flush
		heap_data.Append(other.heap_data, true, &matching_sel, match_count);
		match_count = 0;
	}
	Reduce();
}